

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O1

int64_t pick_interinter_wedge
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                  int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  AV1_COMP *pAVar4;
  MB_MODE_INFO *pMVar5;
  int8_t iVar6;
  undefined3 extraout_var;
  int iVar7;
  int64_t iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  byte bVar11;
  undefined7 in_register_00000011;
  uint32_t n;
  int iVar12;
  char cVar13;
  uint8_t *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dist_by_sse_norm_f;
  double rate_f;
  uint32_t esq [2] [2];
  uint64_t *best_sse_00;
  int8_t local_80f2;
  int8_t local_80f1;
  uint8_t *local_80f0;
  long local_80e8;
  ulong local_80e0;
  AV1_COMP *local_80d8;
  double local_80d0;
  undefined4 local_80c4;
  ulong local_80c0;
  MB_MODE_INFO *local_80b8;
  ulong local_80b0;
  uint8_t *local_80a8;
  uint8_t *local_80a0;
  uint local_8094;
  int16_t *local_8090;
  long local_8088;
  long local_8080;
  long local_8078;
  double local_8070;
  double local_8068;
  uint local_8060;
  uint local_805c;
  uint local_8058;
  uint local_8054 [8201];
  
  local_80b8 = *(x->e_mbd).mi;
  iVar7 = (int)CONCAT71(in_register_00000011,bsize);
  local_80c0 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar11 = block_size_wide[local_80c0];
  local_80e0 = (ulong)bVar11;
  local_80f2 = -1;
  local_80d0 = (double)CONCAT44(local_80d0._4_4_,iVar7);
  local_80d8 = (AV1_COMP *)x;
  local_8090 = residual1;
  if ((cpi->sf).inter_sf.fast_wedge_sign_estimate == 0) {
    bVar1 = block_size_high[local_80c0];
    uVar3 = ((x->e_mbd).cur_buf)->flags;
    iVar12 = 0;
    if ((uVar3 & 8) != 0) {
      iVar12 = (x->e_mbd).bd * 2 + -0x10;
    }
    n = (uint)bVar1 * (uint)bVar11;
    local_80b0 = CONCAT44(local_80b0._4_4_,iVar12);
    local_80f0 = (uint8_t *)
                 CONCAT44(local_80f0._4_4_,
                          *(undefined4 *)
                           ((long)&av1_wedge_params_lookup[0].wedge_types +
                           (ulong)(uint)(iVar7 << 5)));
    if ((uVar3 & 8) == 0) {
      (*aom_subtract_block)
                ((int)bVar1,(int)bVar11,(int16_t *)&local_8060,local_80e0,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,p0,local_80e0);
    }
    else {
      aom_highbd_subtract_block_sse2
                ((uint)bVar1,(uint)bVar11,(int16_t *)&local_8060,local_80e0,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,(uint8_t *)((ulong)p0 >> 1),local_80e0);
    }
    local_80e8 = 0x7fffffffffffffff;
    uVar9 = aom_sum_squares_i16_sse2((int16_t *)&local_8060,n);
    uVar10 = aom_sum_squares_i16_sse2(residual1,n);
    (*av1_wedge_compute_delta_squares)((int16_t *)&local_8060,(int16_t *)&local_8060,residual1,n);
    pAVar4 = local_80d8;
    local_80a0 = (uint8_t *)CONCAT44(local_80a0._4_4_,(int)(char)local_80f0);
    iVar7 = (int)local_80c0;
    if ((char)local_80f0 < '\x01') {
      iVar6 = '\0';
    }
    else {
      local_80e0 = (uVar9 - uVar10) * 0x20;
      local_8078 = *(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar7 << 5));
      local_8080 = (long)((1 << ((byte)local_80b0 & 0x1f)) >> 1);
      local_80b0 = local_80b0 & 0xffffffff;
      local_80f0 = (uint8_t *)(double)n;
      local_80f1 = local_80f2;
      local_8088 = (long)((ModeCosts *)((long)local_80d8 + 0x4230))->wedge_idx_cost[0] +
                   (ulong)(uint)(iVar7 << 6);
      local_8094 = (uint)local_80d0._0_1_;
      local_80c4 = 0;
      cVar13 = '\0';
      local_80a8 = (uint8_t *)CONCAT44(local_80a8._4_4_,n);
      do {
        lVar16 = (long)cVar13;
        lVar15 = local_8078 + lVar16 * 8;
        iVar6 = (*av1_wedge_sign_from_residuals)
                          ((int16_t *)&local_8060,*(uint8_t **)(local_8078 + lVar16 * 8),n,
                           local_80e0);
        uVar9 = (*av1_wedge_sse_from_residuals)
                          (local_8090,diff10,*(uint8_t **)((long)iVar6 * 0x80 + lVar15),n);
        uVar17 = uVar9 + local_8080 >> ((byte)local_80b0 & 0x3f);
        bVar11 = 3;
        if ((((MACROBLOCKD *)((long)pAVar4 + 0x1a0))->cur_buf->flags & 8) != 0) {
          bVar11 = (char)((MACROBLOCKD *)((long)pAVar4 + 0x1a0))->bd - 5;
        }
        if (uVar17 == 0) {
          iVar7 = 0;
          lVar15 = 0;
        }
        else {
          iVar7 = (int)((macroblock_plane *)&pAVar4->ppi)->dequant_QTX[1] >> (bVar11 & 0x1f);
          if (iVar7 < 2) {
            iVar7 = 1;
          }
          local_80d0 = (double)(long)uVar17 / (double)local_80f0;
          dVar19 = log2(local_80d0 / ((double)iVar7 * (double)iVar7));
          av1_model_rd_curvfit((BLOCK_SIZE)local_8094,local_80d0,dVar19,&local_8068,&local_8070);
          dVar19 = 0.0;
          if (0.0 <= local_8068 * (double)local_80f0) {
            dVar19 = local_8068 * (double)local_80f0;
          }
          iVar7 = (int)(dVar19 + 0.5);
          if (iVar7 == 0) {
            iVar7 = 0;
            lVar15 = uVar17 << 4;
          }
          else {
            dVar20 = local_80d0 * local_8070 * (double)local_80f0;
            dVar19 = 0.0;
            if (0.0 <= dVar20) {
              dVar19 = dVar20;
            }
            lVar15 = (long)(dVar19 + 0.5);
            if ((long)(uVar17 * 0x800) <=
                lVar15 * 0x80 + ((long)*(int *)((long)pAVar4 + 0x4218) * (long)iVar7 + 0x100 >> 9))
            {
              iVar7 = 0;
              lVar15 = uVar17 << 4;
            }
          }
          lVar15 = lVar15 << 7;
        }
        lVar15 = ((long)*(int *)((long)pAVar4 + 0x4218) *
                  ((long)iVar7 + (long)*(int *)(local_8088 + lVar16 * 4)) + 0x100 >> 9) + lVar15;
        if (lVar15 < local_80e8) {
          *best_sse = uVar17;
          local_80e8 = lVar15;
          local_80f1 = cVar13;
          local_80c4 = CONCAT31(extraout_var,iVar6);
        }
        cVar13 = cVar13 + '\x01';
        n = (uint32_t)local_80a8;
      } while (cVar13 < (int)local_80a0);
      local_80f2 = local_80f1;
      iVar7 = (int)local_80c0;
      iVar6 = (int8_t)local_80c4;
    }
    iVar8 = local_80e8 -
            ((long)((MACROBLOCK *)local_80d8)->rdmult *
             (long)*(int *)((long)(((MACROBLOCK *)local_80d8)->mode_costs).wedge_idx_cost[0] +
                           (long)local_80f2 * 4 + (ulong)(uint)(iVar7 << 6)) + 0x100 >> 9);
  }
  else {
    local_80f0 = x->plane[0].src.buf;
    iVar7 = x->plane[0].src.stride;
    local_80e8 = CONCAT44(local_80e8._4_4_,iVar7);
    bVar18 = (((x->e_mbd).cur_buf)->flags & 8) == 0;
    bVar1 = block_size_high[local_80c0];
    local_80a0 = (uint8_t *)((ulong)p1 >> 1);
    if (bVar18) {
      local_80a0 = p1;
    }
    bVar2 = estimate_wedge_sign_split_qtr[local_80c0];
    puVar14 = (uint8_t *)((ulong)p0 >> 1);
    if (bVar18) {
      puVar14 = p0;
    }
    (*cpi->ppi->fn_ptr[bVar2].vf)(local_80f0,iVar7,puVar14,(uint)bVar11,&local_8060);
    iVar7 = (int)local_80e8;
    local_80a8 = local_80f0 +
                 (ulong)(bVar11 >> 1) + (long)(int)((int)local_80e8 * (uint)(bVar1 >> 1));
    iVar12 = (int)local_80e0;
    lVar15 = (ulong)((uint)(bVar1 >> 1) * iVar12) + (ulong)(bVar11 >> 1);
    (*cpi->ppi->fn_ptr[bVar2].vf)(local_80a8,(int)local_80e8,puVar14 + lVar15,iVar12,&local_805c);
    puVar14 = local_80a0;
    (*cpi->ppi->fn_ptr[bVar2].vf)(local_80f0,iVar7,local_80a0,iVar12,&local_8058);
    best_sse_00 = (uint64_t *)0x3c3572;
    (*cpi->ppi->fn_ptr[bVar2].vf)(local_80a8,(int)local_80e8,puVar14 + lVar15,iVar12,local_8054);
    pMVar5 = local_80b8;
    iVar6 = (ulong)local_805c + (ulong)local_8058 < (ulong)local_8054[0] + (ulong)local_8060;
    iVar8 = pick_wedge_fixed_sign
                      (local_80d8,(MACROBLOCK *)((ulong)local_80d0 & 0xff),(BLOCK_SIZE)local_8090,
                       diff10,(int16_t *)(ulong)(byte)iVar6,(int8_t)&local_80f2,(int8_t *)best_sse,
                       best_sse_00);
    local_80b8 = pMVar5;
  }
  (local_80b8->interinter_comp).wedge_sign = iVar6;
  (local_80b8->interinter_comp).wedge_index = local_80f2;
  return iVar8;
}

Assistant:

static int64_t pick_interinter_wedge(
    const AV1_COMP *const cpi, MACROBLOCK *const x, const BLOCK_SIZE bsize,
    const uint8_t *const p0, const uint8_t *const p1,
    const int16_t *const residual1, const int16_t *const diff10,
    uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];

  int64_t rd;
  int8_t wedge_index = -1;
  int8_t wedge_sign = 0;

  assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
  assert(cpi->common.seq_params->enable_masked_compound);

  if (cpi->sf.inter_sf.fast_wedge_sign_estimate) {
    wedge_sign = estimate_wedge_sign(cpi, x, bsize, p0, bw, p1, bw);
    rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, wedge_sign,
                               &wedge_index, best_sse);
  } else {
    rd = pick_wedge(cpi, x, bsize, p0, residual1, diff10, &wedge_sign,
                    &wedge_index, best_sse);
  }

  mbmi->interinter_comp.wedge_sign = wedge_sign;
  mbmi->interinter_comp.wedge_index = wedge_index;
  return rd;
}